

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall duckdb::WriteAheadLog::WriteDropTable(WriteAheadLog *this,TableCatalogEntry *entry)

{
  BinarySerializer *this_00;
  SchemaCatalogEntry *pSVar1;
  WriteAheadLogSerializer serializer;
  WriteAheadLogSerializer WStack_5c8;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&WStack_5c8,this,DROP_TABLE);
  pSVar1 = (entry->super_StandardEntry).schema;
  this_00 = &WStack_5c8.serializer;
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"schema");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x1c])
            (this_00,&(pSVar1->super_InCatalogEntry).super_CatalogEntry.name);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x66,"name");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x1c])
            (this_00,&(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&WStack_5c8.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&WStack_5c8);
  return;
}

Assistant:

void WriteAheadLog::WriteDropTable(const TableCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::DROP_TABLE);
	serializer.WriteProperty(101, "schema", entry.schema.name);
	serializer.WriteProperty(102, "name", entry.name);
	serializer.End();
}